

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_opaque_pass.cpp
# Opt level: O3

Status __thiscall spvtools::opt::InlineOpaquePass::ProcessImpl(InlineOpaquePass *this)

{
  Status SVar1;
  Status status;
  Status local_34;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  local_30._M_unused._M_object = &local_34;
  local_34 = SuccessWithoutChange;
  local_18 = std::
             _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_opaque_pass.cpp:102:25)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_opaque_pass.cpp:102:25)>
             ::_M_manager;
  local_30._8_8_ = this;
  IRContext::ProcessReachableCallTree
            ((this->super_InlinePass).super_Pass.context_,(ProcessFunction *)&local_30);
  SVar1 = local_34;
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return SVar1;
}

Assistant:

Pass::Status InlineOpaquePass::ProcessImpl() {
  Status status = Status::SuccessWithoutChange;
  // Do opaque inlining on each function in entry point call tree
  ProcessFunction pfn = [&status, this](Function* fp) {
    status = CombineStatus(status, InlineOpaque(fp));
    return false;
  };
  context()->ProcessReachableCallTree(pfn);
  return status;
}